

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

Color __thiscall Renderer::normal(Renderer *this,Ray ray,Sampler *param_2)

{
  Color CVar1;
  HitInfo local_58;
  
  (**this->acc->_vptr_Accelarator)(&local_58,this->acc,&ray);
  if (local_58.super_Hit.hit == true) {
    if ((local_58.object)->bsdf != (BSDF *)0x0) {
      BSDF::bump((local_58.object)->bsdf,&local_58);
    }
  }
  else {
    local_58.super_Hit.Ns.x = 0.0;
    local_58.super_Hit.Ns.y = 0.0;
    local_58.super_Hit.Ns.z = 0.0;
  }
  CVar1.z = local_58.super_Hit.Ns.z;
  CVar1.x = local_58.super_Hit.Ns.x;
  CVar1.y = local_58.super_Hit.Ns.y;
  return CVar1;
}

Assistant:

Color Renderer::normal(Ray ray, Sampler&) {
	HitInfo hit = acc->hit(ray);
	if (!hit) {
		return Color();
	}
	if (hit.object->bsdf)
		hit.object->bsdf->bump(hit);
	return hit.Ns;
}